

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O3

int OCTET_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                      void *app_key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  ulong uVar5;
  char *pcVar6;
  byte *pbVar7;
  char scratch [52];
  char local_68 [56];
  
  if (sptr == (void *)0x0) {
LAB_00146c5b:
    iVar2 = (*cb)("<absent>",8,app_key);
    iVar2 = iVar2 >> 0x1f;
  }
  else {
    pbVar7 = *sptr;
    iVar2 = *(int *)((long)sptr + 8);
    if (pbVar7 == (byte *)0x0) {
      if (iVar2 != 0) goto LAB_00146c5b;
    }
    else if (0 < iVar2) {
      pbVar4 = pbVar7 + iVar2;
      pcVar3 = local_68;
      uVar5 = 0;
      do {
        pcVar6 = pcVar3;
        if (((uVar5 & 0xf) == 0) && ((uVar5 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
          iVar2 = (*cb)(local_68,(long)pcVar3 - (long)local_68,app_key);
          if (iVar2 < 0) {
            return -1;
          }
          iVar2 = (*cb)("\n",1,app_key);
          if (iVar2 < 0) {
            return -1;
          }
          pcVar6 = local_68;
          iVar2 = ilevel;
          if (0 < ilevel) {
            do {
              iVar1 = (*cb)(" ",1,app_key);
              if (iVar1 < 0) {
                return -1;
              }
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
            pcVar6 = local_68;
          }
        }
        *pcVar6 = "0123456789ABCDEF"[*pbVar7 >> 4];
        pcVar6[1] = "0123456789ABCDEF"[*pbVar7 & 0xf];
        pcVar3 = pcVar6 + 3;
        pcVar6[2] = ' ';
        pbVar7 = pbVar7 + 1;
        uVar5 = uVar5 + 1;
      } while (pbVar7 < pbVar4);
      if ((local_68 < pcVar3) &&
         (iVar2 = (*cb)(local_68,(size_t)(pcVar6 + (2 - (long)local_68)),app_key), iVar2 < 0)) {
        return -1;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
OCTET_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	(void)td;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	for(i = 0; buf < end; buf++, i++) {
		if(!(i % 16) && (i || st->size > 16)) {
			if(cb(scratch, p - scratch, app_key) < 0)
				return -1;
			_i_INDENT(1);
			p = scratch;
		}
		*p++ = h2c[(*buf >> 4) & 0x0F];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Remove the tail space */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}